

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O0

bool __thiscall
cmParseBlanketJSCoverage::LoadCoverageData
          (cmParseBlanketJSCoverage *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  char *pcVar5;
  reference file_00;
  string local_380 [32];
  ostringstream local_360 [8];
  ostringstream cmCTestLog_msg_1;
  string *file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ostringstream local_198 [8];
  ostringstream cmCTestLog_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  cmParseBlanketJSCoverage *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar3 = std::operator<<((ostream *)local_198,"Found ");
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(files);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  poVar3 = std::operator<<(poVar3," Files");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseBlanketJSCoverage.cxx"
               ,0x75,pcVar5,(bool)(this->Coverage->Quiet & 1));
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(files);
  file = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(files);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&file);
    if (!bVar2) {
      return true;
    }
    file_00 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1);
    std::__cxx11::ostringstream::ostringstream(local_360);
    poVar3 = std::operator<<((ostream *)local_360,"Reading JSON File ");
    poVar3 = std::operator<<(poVar3,(string *)file_00);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseBlanketJSCoverage.cxx"
                 ,0x79,pcVar5,(bool)(this->Coverage->Quiet & 1));
    std::__cxx11::string::~string(local_380);
    std::__cxx11::ostringstream::~ostringstream(local_360);
    bVar2 = ReadJSONFile(this,file_00);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

bool cmParseBlanketJSCoverage::LoadCoverageData(std::vector<std::string> files)
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Found " << files.size() << " Files" << std::endl,
                     this->Coverage.Quiet);
  for (std::string const& file : files) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Reading JSON File " << file << std::endl,
                       this->Coverage.Quiet);

    if (!this->ReadJSONFile(file)) {
      return false;
    }
  }
  return true;
}